

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::setOptionValue(Highs *this,string *option,char *value)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  OptionStatus OVar1;
  HighsStatus HVar2;
  HighsLogOptions report_log_options;
  HighsLogOptions local_98;
  
  local_98.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
  local_98.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
  local_98.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
  local_98.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
  local_98.user_log_callback =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
  local_98.user_log_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
  this_00 = &local_98.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(this_00,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
  local_98.user_callback_active =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_98.user_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  OVar1 = setLocalOptionValue(&local_98,option,
                              &(this->options_).super_HighsOptionsStruct.log_options,
                              &(this->options_).records,value);
  HVar2 = kError;
  if (OVar1 == kOk) {
    HVar2 = optionChangeAction(this);
  }
  if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.user_callback.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::setOptionValue(const std::string& option,
                                  const char* value) {
  HighsLogOptions report_log_options = options_.log_options;
  if (setLocalOptionValue(report_log_options, option, options_.log_options,
                          options_.records, value) == OptionStatus::kOk)
    return optionChangeAction();
  return HighsStatus::kError;
}